

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigsf.cpp
# Opt level: O0

void usage(char *progname)

{
  char *progname_local;
  
  printf("%s %s\n","minigsf","[2021-05-21]");
  printf("<%s>\n","http://github.com/loveemu/minigsf");
  printf("\n");
  printf("Usage\n");
  printf("-----\n");
  printf("\n");
  printf("Syntax: `%s (options) [Base name] [Offset] [Size] (Count)`\n",progname);
  printf("\n");
  printf("or\n");
  printf("\n");
  printf("Syntax: `%s (options) [Base name] [Offset] =[Hex pattern] (Count)`\n",progname);
  printf("\n");
  printf("### Options\n");
  printf("\n");
  printf("`--help`\n");
  printf("  : Show help\n");
  printf("\n");
  printf("`--psfby`, `--gsfby` [name]\n");
  printf("  : Set creator name of GSF\n");
  printf("\n");
  printf("`-o` [basename]\n");
  printf("  : Specify minigsf filename (without extension)\n");
  printf("\n");
  return;
}

Assistant:

static void usage(const char * progname)
{
	printf("%s %s\n", APP_NAME, APP_VER);
	printf("<%s>\n", APP_URL);
	printf("\n");
	printf("Usage\n");
	printf("-----\n");
	printf("\n");
	printf("Syntax: `%s (options) [Base name] [Offset] [Size] (Count)`\n", progname);
	printf("\n");
	printf("or\n");
	printf("\n");
	printf("Syntax: `%s (options) [Base name] [Offset] =[Hex pattern] (Count)`\n", progname);
	printf("\n");

	printf("### Options\n");
	printf("\n");
	printf("`--help`\n");
	printf("  : Show help\n");
	printf("\n");
	printf("`--psfby`, `--gsfby` [name]\n");
	printf("  : Set creator name of GSF\n");
	printf("\n");
	printf("`-o` [basename]\n");
	printf("  : Specify minigsf filename (without extension)\n");
	printf("\n");
}